

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicState1::Run(BasicState1 *this)

{
  bool bVar1;
  undefined1 local_2d8 [8];
  VertexBindingState vb15;
  VertexAttribState va15;
  VertexBindingState vb2;
  VertexAttribState va2;
  VertexBindingState vb0;
  VertexAttribState va0;
  VertexBindingState vb;
  GLuint i_1;
  undefined1 local_88 [8];
  VertexAttribState va;
  uint local_20;
  GLuint i;
  GLint p;
  bool status;
  BasicState1 *this_local;
  
  i._3_1_ = 1;
  _p = this;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[2]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x82da,(GLint *)&local_20);
  if ((int)local_20 < 0x10) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n",(ulong)local_20);
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x82d9,(GLint *)&local_20);
  if ((int)local_20 < 0x7ff) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n",
               (ulong)local_20);
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x82e5,(GLint *)&local_20);
  if ((int)local_20 < 0x800) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n",(ulong)local_20);
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8895,(GLint *)&local_20);
  if (local_20 != 0) {
    anon_unknown_0::Output
              ("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n",(ulong)local_20,0);
    i._3_1_ = 0;
  }
  for (va.index = 0; (uint)va.index < 0x10; va.index = va.index + 1) {
    VertexAttribState::VertexAttribState((VertexAttribState *)local_88,va.index);
    bVar1 = VertexAttribState::stateVerify((VertexAttribState *)local_88);
    if (!bVar1) {
      i._3_1_ = 0;
    }
    VertexAttribState::~VertexAttribState((VertexAttribState *)local_88);
  }
  for (vb.index = 0; (uint)vb.index < 0x10; vb.index = vb.index + 1) {
    VertexBindingState::VertexBindingState((VertexBindingState *)&va0.relative_offset,vb.index);
    bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va0.relative_offset);
    if (!bVar1) {
      i._3_1_ = 0;
    }
    VertexBindingState::~VertexBindingState((VertexBindingState *)&va0.relative_offset);
  }
  if ((i._3_1_ & 1) == 0) {
    anon_unknown_0::Output("Default state check failed.\n");
    i._3_1_ = 0;
  }
  VertexAttribState::VertexAttribState((VertexAttribState *)&vb0.index,0);
  va0.super_GLWrapper.m_context._4_4_ = 2;
  va0.array_size = 0x1400;
  va0.array_stride = 1;
  va0.array_buffer_binding = 0x10;
  VertexBindingState::VertexBindingState((VertexBindingState *)&va2.relative_offset,0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,2,0x1400,'\x01',0x10);
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if ((!bVar1) ||
     (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
  {
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
    i._3_1_ = 0;
  }
  VertexAttribState::VertexAttribState((VertexAttribState *)&vb2.index,2);
  va2.super_GLWrapper.m_context._4_4_ = 3;
  va2.array_size = 0x1404;
  va2.array_type = 1;
  va2.array_buffer_binding = 0x200;
  VertexBindingState::VertexBindingState((VertexBindingState *)&va15.relative_offset,2);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,3,0x1404,0x200);
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index);
  if ((!bVar1) ||
     (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset), !bVar1))
  {
    anon_unknown_0::Output("glVertexAttribIFormat state change check failed.\n");
    i._3_1_ = 0;
  }
  va0.array_pointer._0_4_ = this->m_vbo[0];
  vb0.super_GLWrapper.m_context._0_4_ = this->m_vbo[0];
  vb0.buffer = 0x800;
  vb0._44_4_ = 0;
  vb0.offset._0_4_ = 0x80;
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,this->m_vbo[0],0x800,0x80);
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if ((!bVar1) ||
     (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
  {
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
    i._3_1_ = 0;
  }
  va2.array_pointer._0_4_ = this->m_vbo[2];
  vb2.super_GLWrapper.m_context._0_4_ = this->m_vbo[2];
  vb2.buffer = 0x40;
  vb2._44_4_ = 0;
  vb2.offset._0_4_ = 0x100;
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vbo[2],0x40,0x100);
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index);
  if ((!bVar1) ||
     (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset), !bVar1))
  {
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,0);
  va2.array_pointer._4_4_ = 0;
  va2.array_pointer._0_4_ = this->m_vbo[0];
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if ((((!bVar1) ||
       (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1)
       ) || (bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar1)) ||
     (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset), !bVar1))
  {
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
    i._3_1_ = 0;
  }
  VertexAttribState::VertexAttribState((VertexAttribState *)&vb15.index,0xf);
  VertexBindingState::VertexBindingState((VertexBindingState *)local_2d8,0xf);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0xf);
  va0.array_pointer._4_4_ = 0xf;
  va0.array_pointer._0_4_ = 0;
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if (((!bVar1) ||
      (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
     || ((bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb15.index), !bVar1 ||
         (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)local_2d8), !bVar1)))) {
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xf,this->m_vbo[1],0x10,0x20);
  va0.array_pointer._0_4_ = this->m_vbo[1];
  va15.array_pointer._0_4_ = this->m_vbo[1];
  vb15.super_GLWrapper.m_context._0_4_ = this->m_vbo[1];
  vb15.buffer = 0x10;
  vb15._44_4_ = 0;
  vb15.offset._0_4_ = 0x20;
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if (((!bVar1) ||
      (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
     || ((bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb15.index), !bVar1 ||
         (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)local_2d8), !bVar1)))) {
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xf,1,0x140b,'\0',0x400);
  va15.super_GLWrapper.m_context._4_4_ = 1;
  va15.array_size = 0x140b;
  va15.array_buffer_binding = 0x400;
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if ((((!bVar1) ||
       (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1)
       ) || (bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar1)) ||
     (((bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset), !bVar1
       || (bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb15.index), !bVar1)) ||
      (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)local_2d8), !bVar1)))) {
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,this->m_vbo[2]);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,4,0x1401,'\0',8,(void *)0x280);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8892,0);
  va0.super_GLWrapper.m_context._4_4_ = 4;
  va0.array_size = 0x1401;
  va0.array_enabled = 8;
  va0.array_divisor = 0x280;
  va0._68_4_ = 0;
  va0.array_buffer_binding = 0;
  va0.array_stride = 0;
  va0.array_pointer._4_4_ = 0;
  va0.array_pointer._0_4_ = this->m_vbo[2];
  vb0.super_GLWrapper.m_context._0_4_ = this->m_vbo[2];
  vb0.buffer = 0x280;
  vb0._44_4_ = 0;
  vb0.offset._0_4_ = 8;
  va2.array_pointer._0_4_ = this->m_vbo[2];
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if (((!bVar1) ||
      (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
     || ((bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar1 ||
         (((bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset),
           !bVar1 || (bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb15.index),
                     !bVar1)) ||
          (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)local_2d8), !bVar1)))))) {
    anon_unknown_0::Output("glVertexAttribPointer state change check failed.\n");
    i._3_1_ = 0;
  }
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,this->m_vbo[1],0x50,0x18);
  vb0.super_GLWrapper.m_context._0_4_ = this->m_vbo[1];
  vb0.buffer = 0x50;
  vb0._44_4_ = 0;
  vb0.offset._0_4_ = 0x18;
  va2.array_pointer._0_4_ = this->m_vbo[1];
  va0.array_pointer._0_4_ = this->m_vbo[1];
  bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb0.index);
  if (((!bVar1) ||
      (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar1))
     || (((bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar1 ||
          ((bVar1 = VertexBindingState::stateVerify((VertexBindingState *)&va15.relative_offset),
           !bVar1 || (bVar1 = VertexAttribState::stateVerify((VertexAttribState *)&vb15.index),
                     !bVar1)))) ||
         (bVar1 = VertexBindingState::stateVerify((VertexBindingState *)local_2d8), !bVar1)))) {
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
    i._3_1_ = 0;
  }
  if ((i._3_1_ & 1) == 0) {
    this_local = (BasicState1 *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (BasicState1 *)0x0;
  }
  VertexBindingState::~VertexBindingState((VertexBindingState *)local_2d8);
  VertexAttribState::~VertexAttribState((VertexAttribState *)&vb15.index);
  VertexBindingState::~VertexBindingState((VertexBindingState *)&va15.relative_offset);
  VertexAttribState::~VertexAttribState((VertexAttribState *)&vb2.index);
  VertexBindingState::~VertexBindingState((VertexBindingState *)&va2.relative_offset);
  VertexAttribState::~VertexAttribState((VertexAttribState *)&vb0.index);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		if (p < 16)
		{
			Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p < 2047)
		{
			Output("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &p);
		if (p < 2048)
		{
			Output("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n", p);
			status = false;
		}

		glBindVertexArray(m_vao);
		// check default state
		glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &p);
		if (0 != p)
		{
			Output("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n", p, 0);
			status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState va(i);
			if (!va.stateVerify())
				status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexBindingState vb(i);
			if (!vb.stateVerify())
				status = false;
		}
		if (!status)
		{
			Output("Default state check failed.\n");
			status = false;
		}

		VertexAttribState va0(0);
		va0.array_size		 = 2;
		va0.array_type		 = GL_BYTE;
		va0.array_normalized = 1;
		va0.relative_offset  = 16;
		VertexBindingState vb0(0);
		glVertexAttribFormat(0, 2, GL_BYTE, GL_TRUE, 16);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		VertexAttribState va2(2);
		va2.array_size		= 3;
		va2.array_type		= GL_INT;
		va2.array_integer   = 1;
		va2.relative_offset = 512;
		VertexBindingState vb2(2);
		glVertexAttribIFormat(2, 3, GL_INT, 512);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribIFormat state change check failed.\n");
			status = false;
		}

		va0.array_buffer_binding = m_vbo[0];
		vb0.buffer				 = m_vbo[0];
		vb0.offset				 = 2048;
		vb0.stride				 = 128;
		glBindVertexBuffer(0, m_vbo[0], 2048, 128);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		va2.array_buffer_binding = m_vbo[2];
		vb2.buffer				 = m_vbo[2];
		vb2.offset				 = 64;
		vb2.stride				 = 256;
		glBindVertexBuffer(2, m_vbo[2], 64, 256);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribBinding(2, 0);
		va2.binding				 = 0;
		va2.array_buffer_binding = m_vbo[0];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		VertexAttribState  va15(15);
		VertexBindingState vb15(15);
		glVertexAttribBinding(0, 15);
		va0.binding				 = 15;
		va0.array_buffer_binding = 0;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(15, m_vbo[1], 16, 32);
		va0.array_buffer_binding  = m_vbo[1];
		va15.array_buffer_binding = m_vbo[1];
		vb15.buffer				  = m_vbo[1];
		vb15.offset				  = 16;
		vb15.stride				  = 32;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribFormat(15, 1, GL_HALF_FLOAT, GL_FALSE, 1024);
		va15.array_size		 = 1;
		va15.array_type		 = GL_HALF_FLOAT;
		va15.relative_offset = 1024;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glVertexAttribPointer(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 8, (void*)640);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		va0.array_size			 = 4;
		va0.array_type			 = GL_UNSIGNED_BYTE;
		va0.array_stride		 = 8;
		va0.array_pointer		 = 640;
		va0.relative_offset		 = 0;
		va0.array_normalized	 = 0;
		va0.binding				 = 0;
		va0.array_buffer_binding = m_vbo[2];
		vb0.buffer				 = m_vbo[2];
		vb0.offset				 = 640;
		vb0.stride				 = 8;
		va2.array_buffer_binding = m_vbo[2];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribPointer state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(0, m_vbo[1], 80, 24);
		vb0.buffer				 = m_vbo[1];
		vb0.offset				 = 80;
		vb0.stride				 = 24;
		va2.array_buffer_binding = m_vbo[1];
		va0.array_buffer_binding = m_vbo[1];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}